

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall
cmCacheManager::WritePropertyEntries
          (cmCacheManager *this,ostream *os,CacheIterator i,cmMessenger *messenger)

{
  char *pcVar1;
  size_t sVar2;
  iterator iVar3;
  char **ppcVar4;
  string key;
  string helpstring;
  string local_a8;
  string local_88;
  string local_68;
  _Base_ptr local_48;
  CacheEntry *local_40;
  cmMessenger *local_38;
  
  iVar3 = i.Position._M_node;
  if (PersistentProperties[0] != (char *)0x0) {
    local_48 = &((i.Container)->Cache)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = (CacheEntry *)(iVar3._M_node + 2);
    ppcVar4 = PersistentProperties;
    pcVar1 = PersistentProperties[0];
    local_38 = messenger;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,pcVar1,(allocator<char> *)&local_a8);
      if (local_48 == iVar3._M_node) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = CacheEntry::GetProperty(local_40,&local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (pcVar1 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,*ppcVar4,(allocator<char> *)&local_a8);
        std::__cxx11::string::append((char *)&local_68);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,*(long *)(iVar3._M_node + 1),
                   (long)&(iVar3._M_node[1]._M_parent)->_M_color + *(long *)(iVar3._M_node + 1));
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        OutputHelpString(os,&local_68);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,*(long *)(iVar3._M_node + 1),
                   (long)&(iVar3._M_node[1]._M_parent)->_M_color + *(long *)(iVar3._M_node + 1));
        std::__cxx11::string::append((char *)&local_a8);
        std::__cxx11::string::append((char *)&local_a8);
        OutputKey(os,&local_a8);
        std::__ostream_insert<char,std::char_traits<char>>(os,":INTERNAL=",10);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        sVar2 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar1,pcVar1 + sVar2);
        OutputValue(os,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        sVar2 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar1,pcVar1 + sVar2);
        OutputNewlineTruncationWarning(os,&local_a8,&local_88,local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar1 = ppcVar4[1];
      ppcVar4 = ppcVar4 + 1;
    } while (pcVar1 != (char *)0x0);
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os, CacheIterator i,
                                          cmMessenger* messenger)
{
  for (const char** p = cmCacheManager::PersistentProperties; *p; ++p) {
    if (const char* value = i.GetProperty(*p)) {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      cmCacheManager::OutputKey(os, key);
      os << ":INTERNAL=";
      cmCacheManager::OutputValue(os, value);
      os << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(os, key, value,
                                                     messenger);
    }
  }
}